

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Progress.H
# Opt level: O2

void __thiscall Fl_Progress::~Fl_Progress(Fl_Progress *this)

{
  Fl_Widget::~Fl_Widget(&this->super_Fl_Widget);
  operator_delete(this,0x88);
  return;
}

Assistant:

class FL_EXPORT Fl_Progress : public Fl_Widget {
  
  float	value_,
	minimum_,
	maximum_;

  protected:

  virtual void draw();

  public:

  Fl_Progress(int x, int y, int w, int h, const char *l = 0);

  /** Sets the maximum value in the progress widget.  */
  void	maximum(float v) { maximum_ = v; redraw(); }
  /** Gets the maximum value in the progress widget.  */
  float	maximum() const { return (maximum_); }

  /** Sets the minimum value in the progress widget.  */
  void	minimum(float v) { minimum_ = v; redraw(); }
  /** Gets the minimum value in the progress widget.  */
  float	minimum() const { return (minimum_); }

  /** Sets the current value in the progress widget.  */
  void	value(float v) { value_ = v; redraw(); }
  /** Gets the current value in the progress widget.  */
  float	value() const { return (value_); }
}